

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O3

void UninterruptibleSleep(microseconds *n)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  long in_FS_OFFSET;
  timespec __ts;
  timespec local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = n->__r;
  if (0 < (long)uVar1) {
    local_20.tv_sec = uVar1 / 1000000;
    local_20.tv_nsec = (uVar1 % 1000000) * 1000;
    do {
      iVar2 = nanosleep(&local_20,&local_20);
      if (iVar2 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UninterruptibleSleep(const std::chrono::microseconds& n) { std::this_thread::sleep_for(n); }